

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrbtree_test.c
# Opt level: O2

void test_speed(int nvalues)

{
  int iVar1;
  undefined8 in_RAX;
  xrbt_t *tr;
  clock_t cVar2;
  xrbt_iter_t pxVar3;
  clock_t cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  int value;
  uint local_34;
  
  uVar6 = 0;
  _value = in_RAX;
  tr = xrbt_new(4,on_cmp2,(xrbt_destroy_cb)0x0);
  srand(0x1e240);
  cVar2 = clock();
  uVar5 = 0;
  if (0 < nvalues) {
    uVar5 = nvalues;
  }
  do {
    if (uVar5 == uVar6) {
LAB_001015a7:
      cVar4 = clock();
      _value = CONCAT44(nvalues,value);
      printf("insert %d random integer done, values %u, time %lfs.\n",
             (double)(cVar4 - cVar2) / 1000000.0,(ulong)(uint)nvalues,(ulong)(uint)tr->size);
      tree_overview(tr);
      srand(0x1e240);
      uVar7 = 0;
      cVar2 = clock();
      uVar6 = uVar5;
      while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
        iVar1 = rand_int();
        _value = CONCAT44(local_34,iVar1);
        pxVar3 = xrbt_find(tr,&value);
        uVar7 = (uVar7 + 1) - (uint)(pxVar3 == (xrbt_iter_t)0x0);
      }
      cVar4 = clock();
      uVar6 = local_34;
      printf("search %d random integer done, time %lfs, %d found.\n",
             (double)(cVar4 - cVar2) / 1000000.0,(ulong)local_34,(ulong)uVar7);
      srand(0x1e240);
      uVar7 = 0;
      cVar2 = clock();
      while (bVar8 = uVar5 != 0, uVar5 = uVar5 - 1, bVar8) {
        iVar1 = rand_int();
        _value = CONCAT44(local_34,iVar1);
        pxVar3 = xrbt_find(tr,&value);
        if (pxVar3 == (xrbt_iter_t)0x0) {
          uVar7 = uVar7 + 1;
        }
        else {
          xrbt_erase(tr,pxVar3);
        }
      }
      cVar4 = clock();
      printf("remove %d random integer done, time %lfs, %d not found.\n",
             (double)(cVar4 - cVar2) / 1000000.0,(ulong)uVar6,(ulong)uVar7);
      puts("press any key to continue...");
      getchar();
      xrbt_free(tr);
      return;
    }
    iVar1 = rand_int();
    _value = CONCAT44(local_34,iVar1);
    pxVar3 = xrbt_insert_ex(tr,&value,tr->data_size);
    if (pxVar3 == (xrbt_iter_t)0x0) {
      printf("out of memory when insert %d value.\n",(ulong)uVar6);
      goto LAB_001015a7;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void test_speed(int nvalues)
{
    xrbt_t* rb = xrbt_new(sizeof(int), on_cmp2, NULL);
    clock_t begin, end;
    int value, count, i;

    srand(RAND_SEED);
    // generate 'nvalues' random integer and insert into 'rb'
    begin = clock();
    for (i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        if (!xrbt_insert(rb, &value))
        {
            printf("out of memory when insert %d value.\n", i);
            break;
        }
    }
    end = clock();
    printf("insert %d random integer done, values %u, time %lfs.\n",
            nvalues, (unsigned)xrbt_size(rb), (double)(end - begin) / CLOCKS_PER_SEC);

    tree_overview(rb);

    // reset the same seed to get the same series number
    srand(RAND_SEED);
    // search time test
    begin = clock();
    for (count = 0, i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        if (xrbt_find(rb, &value))
            ++count;
    }
    end = clock();
    printf("search %d random integer done, time %lfs, %d found.\n",
            nvalues, (double)(end - begin) / CLOCKS_PER_SEC, count);

    // reset the same seed to get the same series number
    srand(RAND_SEED);
    // remove time test
    begin = clock();
    for (count = 0, i = 0; i < nvalues; ++i)
    {
        value = rand_int();
        xrbt_iter_t iter = xrbt_find(rb, &value);
        if (iter)
            xrbt_erase(rb, iter);
        else
            ++count;
    }
    end = clock();
    printf("remove %d random integer done, time %lfs, %d not found.\n",
            nvalues, (double)(end - begin) / CLOCKS_PER_SEC, count);

    printf("press any key to continue...\n");
    getchar();
    xrbt_free(rb);
}